

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.hpp
# Opt level: O2

void __thiscall
Propagator::Propagator
          (Propagator *this,uint wave_height,uint wave_width,bool periodic_output,
          PropagatorState *propagator_state)

{
  this->patterns_size =
       ((long)(propagator_state->
              super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(propagator_state->
             super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0x60;
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::vector(&this->propagator_state,propagator_state);
  this->wave_width = wave_width;
  this->wave_height = wave_height;
  this->periodic_output = periodic_output;
  (this->propagating).
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->propagating).
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->propagating).
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Array3D<std::array<int,_4UL>_>::Array3D
            (&this->compatible,(ulong)wave_height,(ulong)wave_width,this->patterns_size);
  init_compatible(this);
  return;
}

Assistant:

Propagator(unsigned wave_height, unsigned wave_width, bool periodic_output,
             PropagatorState propagator_state) noexcept
      : patterns_size(propagator_state.size()),
        propagator_state(propagator_state), wave_width(wave_width),
        wave_height(wave_height), periodic_output(periodic_output),
        compatible(wave_height, wave_width, patterns_size) {
    init_compatible();
  }